

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutBoxEqualsSumOfAdvances(LayoutTests *this)

{
  element_type *peVar1;
  glyph *local_778;
  allocator local_6d1;
  string local_6d0;
  LocationInfo local_6b0;
  float local_688;
  allocator local_681;
  string local_680;
  LocationInfo local_660;
  float local_638;
  box_r local_634;
  box_r box5;
  box_r box4;
  richtext_t local_600;
  allocator local_591;
  string local_590;
  richtext_t local_570;
  undefined1 local_508 [8];
  layout l5;
  layout l4;
  factory_ptr f2;
  char_to_index indices2 [3];
  string local_438;
  LocationInfo local_418;
  float local_3f0;
  allocator local_3e9;
  string local_3e8;
  LocationInfo local_3c8;
  float local_3a0;
  allocator local_399;
  string local_398;
  LocationInfo local_378;
  float local_350;
  box_r local_34c;
  box_r box3;
  box_r box2;
  box_r box1;
  richtext_t local_310;
  allocator local_2a1;
  string local_2a0;
  richtext_t local_280;
  allocator local_211;
  string local_210;
  richtext_t local_1f0;
  undefined1 local_188 [8];
  layout l3;
  layout l2;
  layout l1;
  undefined1 local_88 [8];
  factory_ptr f1;
  glyph glyphs [2];
  char_to_index indices1 [3];
  LayoutTests *this_local;
  
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100000041;
  f1.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x402a000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)local_88,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,
             (glyph (*) [2])
             &glyphs[1].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  layout::layout((layout *)&l2._box);
  layout::layout((layout *)&l3._box);
  layout::layout((layout *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"A",&local_211);
  R(&local_1f0,&local_210);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_88);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l2._box,&local_1f0,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"AAB",&local_2a1);
  R(&local_280,&local_2a0);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_88);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l3._box,&local_280,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&box1.h,"BQA",(allocator *)((long)&box1.w + 3));
  R(&local_310,(string *)&box1.h);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_88);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_188,&local_310,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_310);
  std::__cxx11::string::~string((string *)&box1.h);
  std::allocator<char>::~allocator((allocator<char> *)((long)&box1.w + 3));
  box2 = layout::get_box((layout *)&l2._box);
  box3 = layout::get_box((layout *)&l3._box);
  local_34c = layout::get_box((layout *)local_188);
  local_350 = 11.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_399);
  ut::LocationInfo::LocationInfo(&local_378,&local_398,0x5e);
  ut::are_equal<float,float>(&local_350,&box2.w,&local_378);
  ut::LocationInfo::~LocationInfo(&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  local_3a0 = 35.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_3e9);
  ut::LocationInfo::LocationInfo(&local_3c8,&local_3e8,0x5f);
  ut::are_equal<float,float>(&local_3a0,&box3.w,&local_3c8);
  ut::LocationInfo::~LocationInfo(&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  local_3f0 = 37.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_438,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)((long)&indices2[2].index + 3));
  ut::LocationInfo::LocationInfo(&local_418,&local_438,0x60);
  ut::are_equal<float,float>(&local_3f0,&local_34c.w,&local_418);
  ut::LocationInfo::~LocationInfo(&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&indices2[2].index + 3));
  f2.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x41;
  indices2[0].symbol = 0x42;
  indices2[0].index = 0;
  indices2[1].symbol = 0x51;
  indices2[1].index = 0;
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)&l4._box,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,
             (glyph (*) [2])
             &f2.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  layout::layout((layout *)&l5._box);
  layout::layout((layout *)local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"A",&local_591);
  R(&local_570,&local_590);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&l4._box);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l5._box,&local_570,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&box4.h,"ABQABQABQ",(allocator *)((long)&box4.w + 3));
  R(&local_600,(string *)&box4.h);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&l4._box);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_508,&local_600,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_600);
  std::__cxx11::string::~string((string *)&box4.h);
  std::allocator<char>::~allocator((allocator<char> *)((long)&box4.w + 3));
  box5 = layout::get_box((layout *)&l5._box);
  local_634 = layout::get_box((layout *)local_508);
  local_638 = 13.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_680,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_681);
  ut::LocationInfo::LocationInfo(&local_660,&local_680,0x72);
  ut::are_equal<float,float>(&local_638,&box5.w,&local_660);
  ut::LocationInfo::~LocationInfo(&local_660);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  local_688 = 117.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_6d1);
  ut::LocationInfo::LocationInfo(&local_6b0,&local_6d0,0x73);
  ut::are_equal<float,float>(&local_688,&local_634.w,&local_6b0);
  ut::LocationInfo::~LocationInfo(&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  layout::~layout((layout *)local_508);
  layout::~layout((layout *)&l5._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)&l4._box);
  layout::~layout((layout *)local_188);
  layout::~layout((layout *)&l3._box);
  layout::~layout((layout *)&l2._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_88);
  local_778 = (glyph *)&glyphs[1].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_778 = local_778 + -1;
    mocks::font_accessor::glyph::~glyph(local_778);
  } while (local_778 !=
           (glyph *)&f1.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( SingleLineUnboundLayoutBoxEqualsSumOfAdvances )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);

				// ACT
				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(11.0f, box1.w);
				assert_equal(35.0f, box2.w);
				assert_equal(37.0f, box3.w);

				// INIT
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 0 }, { L'Q', 0 }, };
				factory_ptr f2 = create_single_font_factory(c_fm1, indices2, glyphs);

				// INIT / ACT
				layout l4;
				layout l5;

				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQABQABQ"), limit::none(), *f2);

				// ACT
				box_r box4 = l4.get_box();
				box_r box5 = l5.get_box();

				// ASSERT
				assert_equal(13.0f, box4.w);
				assert_equal(117.0f, box5.w);
			}